

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::ByteCodeWriter::DoDynamicProfileOpcode(ByteCodeWriter *this,Phase tag,bool noHeuristics)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  
  bVar1 = DynamicProfileInfo::IsEnabled(tag,this->m_functionWrite);
  if (bVar1) {
    bVar1 = true;
    if (tag == InlinePhase) {
      uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
      LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01436260,InlinePhase,uVar3,LVar4);
      if (((!bVar2 && !noHeuristics) && (this->m_hasLoop == true)) && (this->m_loopNest == 0)) {
        uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
        LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
        bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineOutsideLoopsPhase,uVar3,LVar4);
        bVar1 = !bVar1;
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::DoDynamicProfileOpcode(Phase tag, bool noHeuristics) const
    {
#if ENABLE_PROFILE_INFO
        if (!DynamicProfileInfo::IsEnabled(tag, this->m_functionWrite))
        {
            return false;
        }

        // Other heuristics
        switch (tag)
        {
        case Phase::InlinePhase:
            // Do profile opcode everywhere if we are an inline candidate
            // Otherwise, only in loops if the function has loop
#pragma prefast(suppress:6236, "DevDiv bug 830883. False positive when PHASE_OFF is #defined as '(false)'.")
            return PHASE_FORCE(Phase::InlinePhase, this->m_functionWrite) ||
                ((noHeuristics || !this->m_hasLoop || (this->m_loopNest != 0) ||
                        !(PHASE_OFF(InlineOutsideLoopsPhase, this->m_functionWrite))));

        default:
            return true;
        }
#else
        return false;
#endif
    }